

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QList<QGraphicsItem_*>_>::resize(QList<QList<QGraphicsItem_*>_> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QList<QGraphicsItem_*>_> *in_RSI;
  QArrayDataPointer<QList<QGraphicsItem_*>_> *in_RDI;
  QList<QList<QGraphicsItem_*>_> *unaff_retaddr;
  QArrayDataPointer<QList<QGraphicsItem_*>_> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QList<QGraphicsItem_*>_>::size((QList<QList<QGraphicsItem_*>_> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QList<QGraphicsItem_*>_>::operator->(in_RDI);
    QArrayDataPointer<QList<QGraphicsItem_*>_>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }